

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonConvert.h
# Opt level: O3

void __thiscall
Json::JsonConvert::JsonConvert(JsonConvert *this,FILE *fp,bool format,int indent,bool escape)

{
  JsonParser local_90;
  
  JsonParser::JsonParser(&local_90,fp);
  JsonConvert(this,&local_90,format,indent,escape);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.__reader.__JSON._M_dataplus._M_p != &local_90.__reader.__JSON.field_2) {
    operator_delete(local_90.__reader.__JSON._M_dataplus._M_p,
                    local_90.__reader.__JSON.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.jsonValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.__buffer_value._M_dataplus._M_p != &local_90.__buffer_value.field_2) {
    operator_delete(local_90.__buffer_value._M_dataplus._M_p,
                    local_90.__buffer_value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit JsonConvert(FILE *fp, bool format = false, int indent = 4, bool escape = false)
                : JsonConvert(JsonParser(fp), format, indent, escape) {}